

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

void __thiscall
Chainstate::InvalidBlockFound(Chainstate *this,CBlockIndex *pindex,BlockValidationState *state)

{
  long lVar1;
  BlockValidationResult BVar2;
  value_type *in_RDX;
  long in_RSI;
  ValidationState<BlockValidationResult> *in_RDI;
  long in_FS_OFFSET;
  CBlockIndex *in_stack_00000078;
  Chainstate *in_stack_00000080;
  ValidationState<BlockValidationResult> *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)in_RDI,(char *)in_RDX,(int)((ulong)in_RDI >> 0x20),
             (AnnotatedMixin<std::recursive_mutex> *)0x148c67d);
  BVar2 = ValidationState<BlockValidationResult>::GetResult(in_RDI);
  if (BVar2 != BLOCK_MUTATED) {
    *(uint *)(in_RSI + 0x58) = *(uint *)(in_RSI + 0x58) | 0x20;
    std::set<CBlockIndex_*,_std::less<CBlockIndex_*>,_std::allocator<CBlockIndex_*>_>::insert
              ((set<CBlockIndex_*,_std::less<CBlockIndex_*>,_std::allocator<CBlockIndex_*>_> *)
               this_00,in_RDX);
    std::set<CBlockIndex_*,_std::less<CBlockIndex_*>,_std::allocator<CBlockIndex_*>_>::insert
              ((set<CBlockIndex_*,_std::less<CBlockIndex_*>,_std::allocator<CBlockIndex_*>_> *)
               this_00,in_RDX);
    std::set<CBlockIndex_*,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>::erase
              ((set<CBlockIndex_*,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>
                *)this_00,in_RDX);
    InvalidChainFound(in_stack_00000080,in_stack_00000078);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Chainstate::InvalidBlockFound(CBlockIndex* pindex, const BlockValidationState& state)
{
    AssertLockHeld(cs_main);
    if (state.GetResult() != BlockValidationResult::BLOCK_MUTATED) {
        pindex->nStatus |= BLOCK_FAILED_VALID;
        m_chainman.m_failed_blocks.insert(pindex);
        m_blockman.m_dirty_blockindex.insert(pindex);
        setBlockIndexCandidates.erase(pindex);
        InvalidChainFound(pindex);
    }
}